

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall crnlib::mipmapped_texture::is_y_flipped(mipmapped_texture *this)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  uVar5 = (ulong)(this->m_faces).m_size;
  bVar8 = uVar5 != 0;
  if (bVar8) {
    pvVar2 = (this->m_faces).m_p;
    uVar6 = 0;
    do {
      uVar1 = pvVar2[uVar6].m_size;
      bVar9 = uVar1 != 0;
      if (bVar9) {
        ppmVar3 = pvVar2[uVar6].m_p;
        if (((*ppmVar3)->m_orient_flags & cOrientationFlagYFlipped) == cDefaultOrientationFlags) {
          lVar7 = 0;
          do {
            if (uVar1 - 1 == (int)lVar7) goto LAB_00135582;
            lVar4 = lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while ((ppmVar3[lVar4]->m_orient_flags & cOrientationFlagYFlipped) ==
                   cDefaultOrientationFlags);
          bVar9 = (uint)lVar7 < uVar1;
        }
        if (bVar9) {
          return bVar8;
        }
      }
LAB_00135582:
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < uVar5;
    } while (uVar6 != uVar5);
  }
  return bVar8;
}

Assistant:

bool mipmapped_texture::is_y_flipped() const {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (m_faces[l][m]->is_y_flipped())
        return true;

  return false;
}